

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  bool bVar1;
  ValueType VVar2;
  ArrayIndex AVar3;
  pointer ppVar4;
  Value *other;
  mapped_type *this_00;
  iterator __position;
  iterator itLast;
  CZString keyLast;
  CZString keey;
  ArrayIndex i;
  ArrayIndex oldSize;
  _Self local_40;
  iterator it;
  CZString key;
  Value *removed_local;
  ArrayIndex index_local;
  Value *this_local;
  
  VVar2 = type(this);
  if (VVar2 == arrayValue) {
    CZString::CZString((CZString *)&it,index);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    _oldSize = std::
               map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::end((this->value_).map_);
    bVar1 = std::operator==(&local_40,(_Self *)&oldSize);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      if (removed != (Value *)0x0) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
                 operator->(&local_40);
        operator=(removed,&ppVar4->second);
      }
      AVar3 = size(this);
      for (keey._12_4_ = index; (uint)keey._12_4_ < AVar3 - 1; keey._12_4_ = keey._12_4_ + 1) {
        CZString::CZString((CZString *)&keyLast.field_1.storage_,keey._12_4_);
        other = operator[](this,keey._12_4_ + 1);
        this_00 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::operator[]((this->value_).map_,(key_type *)&keyLast.field_1.storage_);
        operator=(this_00,other);
        CZString::~CZString((CZString *)&keyLast.field_1.storage_);
      }
      CZString::CZString((CZString *)&itLast,AVar3 - 1);
      __position = std::
                   map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   ::find((this->value_).map_,(key_type *)&itLast);
      std::
      map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                          *)(this->value_).map_,__position);
      this_local._7_1_ = true;
      CZString::~CZString((CZString *)&itLast);
    }
    CZString::~CZString((CZString *)&it);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type() != arrayValue) {
    return false;
  }
  CZString key(index);
  auto it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  if (removed)
    *removed = std::move(it->second);
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i) {
    CZString keey(i);
    (*value_.map_)[keey] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  auto itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}